

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.h
# Opt level: O1

void __thiscall
Js::DeferredTypeHandlerBase::DeferredTypeHandlerBase
          (DeferredTypeHandlerBase *this,DeferredTypeHandlerBase *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler =
       (_func_int **)&PTR___cxa_pure_virtual_01557c08;
  bVar3 = (typeHandler->super_DynamicTypeHandler).propertyTypes;
  (this->super_DynamicTypeHandler).propertyTypes = bVar3;
  (this->super_DynamicTypeHandler).flags = (typeHandler->super_DynamicTypeHandler).flags;
  (this->super_DynamicTypeHandler).offsetOfInlineSlots =
       (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots;
  (this->super_DynamicTypeHandler).slotCapacity =
       (typeHandler->super_DynamicTypeHandler).slotCapacity;
  (this->super_DynamicTypeHandler).unusedBytes = (typeHandler->super_DynamicTypeHandler).unusedBytes
  ;
  (this->super_DynamicTypeHandler).inlineSlotCapacity =
       (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity;
  (this->super_DynamicTypeHandler).protoCachesWereInvalidated = false;
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_0150b8f8
  ;
  if ((bVar3 & 0x40) >> 6 != ((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DeferredTypeHandler.h"
                                ,0x19,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar2) goto LAB_00b560c7;
    *puVar5 = 0;
  }
  bVar3 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  bVar4 = DynamicTypeHandler::GetPropertyTypes(&typeHandler->super_DynamicTypeHandler);
  if ((bVar3 & 0x10) >> 4 != (bVar4 & 0x10) >> 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DeferredTypeHandler.h"
                                ,0x1a,
                                "(this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties())"
                                ,
                                "this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties()"
                               );
    if (!bVar2) {
LAB_00b560c7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

DeferredTypeHandlerBase(DeferredTypeHandlerBase * typeHandler) : DynamicTypeHandler(typeHandler)
        {
            Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
            Assert(this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties());
        }